

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::Transform(ON_PolyCurve *this,ON_Xform *xform)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ON_Curve **ppOVar4;
  bool local_31;
  bool local_21;
  int local_20;
  bool rc;
  int segment_index;
  int count;
  ON_Xform *xform_local;
  ON_PolyCurve *this_local;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  iVar2 = Count(this);
  bVar1 = -(0 < iVar2);
  local_20 = 0;
  while( true ) {
    local_21 = (bool)(bVar1 & 1);
    local_31 = false;
    if (local_20 < iVar2) {
      local_31 = local_21;
    }
    if (local_31 == false) break;
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_20);
    iVar3 = (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(*ppOVar4,xform)
    ;
    bVar1 = (byte)iVar3;
    local_20 = local_20 + 1;
  }
  return local_21;
}

Assistant:

bool
ON_PolyCurve::Transform( const ON_Xform& xform )
{
  TransformUserData(xform);
  DestroyRuntimeCache();
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->Transform( xform );
  }
  return rc;
}